

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QString,QMimeTypeXMLData>::emplace<QMimeTypeXMLData_const&>
          (QHash<QString,QMimeTypeXMLData> *this,QString *key,QMimeTypeXMLData *args)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QMimeTypeXMLData local_98;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
    local_98._0_8_ = (Data *)0x0;
LAB_0044e3b2:
    QHash<QString,_QMimeTypeXMLData>::detach((QHash<QString,_QMimeTypeXMLData> *)this);
    pVar2 = (piter)emplace_helper<QMimeTypeXMLData_const&>(this,key,args);
    QHash<QString,_QMimeTypeXMLData>::~QHash((QHash<QString,_QMimeTypeXMLData> *)&local_98);
  }
  else {
    if (1 < *(uint *)&pDVar1->ref) {
      local_98._0_8_ = pDVar1;
      if (*(uint *)&pDVar1->ref != 0xffffffff) {
        LOCK();
        pDVar1->ref = (RefCount)(*(uint *)&pDVar1->ref + 1);
        UNLOCK();
      }
      goto LAB_0044e3b2;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar2 = (piter)emplace_helper<QMimeTypeXMLData_const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_0044e45c;
    }
    QMimeTypeXMLData::QMimeTypeXMLData(&local_98,args);
    pVar2 = (piter)QHash<QString,_QMimeTypeXMLData>::emplace_helper<QMimeTypeXMLData>
                             ((QHash<QString,_QMimeTypeXMLData> *)this,key,&local_98);
    QMimeTypeXMLData::~QMimeTypeXMLData(&local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar2;
  }
LAB_0044e45c:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }